

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O3

void __thiscall
TPZFNMatrix<1,_Fad<double>_>::TPZFNMatrix
          (TPZFNMatrix<1,_Fad<double>_> *this,int64_t row,int64_t col,Fad<double> *val)

{
  uint uVar1;
  ulong uVar2;
  Fad<double> local_48;
  
  (this->super_TPZFMatrix<Fad<double>_>).super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01902480;
  TPZFMatrix<Fad<double>_>::TPZFMatrix
            (&this->super_TPZFMatrix<Fad<double>_>,&PTR_PTR_01902738,row,col,this->fBuf,1);
  (this->super_TPZFMatrix<Fad<double>_>).super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01902480;
  Fad<double>::Fad(this->fBuf);
  Fad<double>::Fad(this->fBuf + 1);
  local_48.val_ = val->val_;
  uVar1 = (val->dx_).num_elts;
  local_48.dx_.ptr_to_data = (double *)0x0;
  local_48.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar2 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar2 = (long)(int)uVar1 * 8;
    }
    local_48.dx_.ptr_to_data = (double *)operator_new__(uVar2);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_48.dx_.ptr_to_data,(EVP_PKEY_CTX *)(val->dx_).ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_48.defaultVal = val->defaultVal;
  TPZFMatrix<Fad<double>_>::operator=(&this->super_TPZFMatrix<Fad<double>_>,&local_48);
  Fad<double>::~Fad(&local_48);
  return;
}

Assistant:

inline  TPZFNMatrix(int64_t row, int64_t col, const TVar &val) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {
        TPZFMatrix<TVar>::operator=(val);
    }